

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O2

void nk_buffer_reset(nk_buffer *buffer,nk_buffer_allocation_type type)

{
  nk_buffer_marker *pnVar1;
  nk_size nVar2;
  nk_size nVar3;
  
  if (buffer != (nk_buffer *)0x0) {
    if (type == NK_BUFFER_BACK) {
      nVar2 = buffer->marker[1].offset;
      nVar3 = (buffer->memory).size;
      buffer->needed = buffer->needed + (nVar2 - nVar3);
      pnVar1 = buffer->marker + 1;
      if (buffer->marker[1].active == 0) {
        nVar2 = nVar3;
      }
      buffer->size = nVar2;
    }
    else {
      nVar2 = buffer->marker[type].offset;
      buffer->needed = buffer->needed + (nVar2 - buffer->allocated);
      pnVar1 = buffer->marker + type;
      nVar3 = 0;
      if (buffer->marker[type].active != 0) {
        nVar3 = nVar2;
      }
      buffer->allocated = nVar3;
    }
    pnVar1->active = 0;
    return;
  }
  __assert_fail("buffer",
                "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/deps/nuklear.h",
                0x200c,"void nk_buffer_reset(struct nk_buffer *, enum nk_buffer_allocation_type)");
}

Assistant:

NK_API void
nk_buffer_reset(struct nk_buffer *buffer, enum nk_buffer_allocation_type type)
{
    NK_ASSERT(buffer);
    if (!buffer) return;
    if (type == NK_BUFFER_BACK) {
        /* reset back buffer either back to marker or empty */
        buffer->needed -= (buffer->memory.size - buffer->marker[type].offset);
        if (buffer->marker[type].active)
            buffer->size = buffer->marker[type].offset;
        else buffer->size = buffer->memory.size;
        buffer->marker[type].active = nk_false;
    } else {
        /* reset front buffer either back to back marker or empty */
        buffer->needed -= (buffer->allocated - buffer->marker[type].offset);
        if (buffer->marker[type].active)
            buffer->allocated = buffer->marker[type].offset;
        else buffer->allocated = 0;
        buffer->marker[type].active = nk_false;
    }
}